

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void * add234_internal(tree234 *t,void *e,int index)

{
  void *pvVar1;
  node234 *pnVar2;
  long lVar3;
  node234_conflict *pnVar4;
  ulong uVar5;
  void **ppvVar6;
  int iVar7;
  void **ppvVar8;
  node234 **ppnVar9;
  node234_conflict *pnVar10;
  node234 *pnVar11;
  node234 *pnVar12;
  int iVar13;
  void *local_58;
  
  pnVar11 = t->root;
  if (t->root == (node234_conflict *)0x0) {
    pnVar4 = (node234_conflict *)safemalloc(1,0x50,0);
    t->root = pnVar4;
    pnVar4->elems[2] = (void *)0x0;
    t->root->elems[1] = (void *)0x0;
    t->root->kids[1] = (node234 *)0x0;
    t->root->kids[0] = (node234 *)0x0;
    t->root->kids[3] = (node234 *)0x0;
    t->root->kids[2] = (node234 *)0x0;
    pnVar4 = t->root;
    pnVar4->parent = (node234_conflict *)0x0;
    pnVar4->counts[0] = 0;
    pnVar4->counts[1] = 0;
    pnVar4->counts[2] = 0;
    pnVar4->counts[3] = 0;
    pnVar4->elems[0] = e;
  }
  else {
    do {
      pnVar4 = pnVar11;
      if (index < 0) {
        iVar7 = (*t->cmp)(e,pnVar4->elems[0]);
        if (iVar7 < 0) {
LAB_0016cf39:
          uVar5 = 0;
        }
        else {
          if (iVar7 == 0) {
            return pnVar4->elems[0];
          }
          uVar5 = 1;
          if (pnVar4->elems[1] != (void *)0x0) {
            iVar7 = (*t->cmp)(e,pnVar4->elems[1]);
            if (-1 < iVar7) {
              if (iVar7 == 0) {
                return pnVar4->elems[1];
              }
              uVar5 = 2;
              if (pnVar4->elems[2] != (void *)0x0) {
                iVar7 = (*t->cmp)(e,pnVar4->elems[2]);
                if ((-1 < iVar7) && (uVar5 = 3, iVar7 == 0)) {
                  return pnVar4->elems[2];
                }
              }
            }
          }
        }
      }
      else if (pnVar4->kids[0] == (node234 *)0x0) {
        uVar5 = (ulong)(uint)index;
      }
      else {
        if (index <= pnVar4->counts[0]) goto LAB_0016cf39;
        index = index + ~pnVar4->counts[0];
        uVar5 = 1;
        if (pnVar4->counts[1] < index) {
          index = index + ~pnVar4->counts[1];
          uVar5 = 2;
          if (pnVar4->counts[2] < index) {
            index = index + ~pnVar4->counts[2];
            uVar5 = 3;
            if (pnVar4->counts[3] < index) {
              return (void *)0x0;
            }
          }
        }
      }
      pnVar11 = pnVar4->kids[uVar5];
    } while (pnVar4->kids[uVar5] != (node234 *)0x0);
    ppnVar9 = pnVar4->kids + uVar5;
    ppvVar6 = pnVar4->elems;
    ppvVar8 = pnVar4->elems + 1;
    pvVar1 = pnVar4->elems[1];
    local_58 = e;
    if (pvVar1 == (void *)0x0) {
      iVar13 = 0;
      iVar7 = 0;
      pnVar11 = (node234_conflict *)0x0;
      pnVar2 = (node234 *)0x0;
    }
    else {
      iVar7 = 0;
      iVar13 = 0;
      pnVar10 = (node234_conflict *)0x0;
      pnVar12 = (node234 *)0x0;
      do {
        pnVar11 = pnVar4;
        if (pnVar11->elems[2] == (void *)0x0) {
          if (ppnVar9 == pnVar11->kids) {
            pnVar11->elems[2] = pvVar1;
            pnVar2 = pnVar11->kids[2];
            pnVar11->kids[2] = pnVar11->kids[1];
            pnVar11->kids[3] = pnVar2;
            *(undefined8 *)(pnVar11->counts + 2) = *(undefined8 *)(pnVar11->counts + 1);
            *ppvVar8 = *ppvVar6;
            pnVar11->kids[1] = pnVar10;
            pnVar11->counts[1] = iVar13;
            *ppvVar6 = local_58;
            pnVar11->kids[0] = pnVar12;
            pnVar11->counts[0] = iVar7;
          }
          else {
            if (ppnVar9 == pnVar11->kids + 1) {
              pnVar11->kids[3] = pnVar11->kids[2];
              pnVar11->counts[3] = pnVar11->counts[2];
              pnVar11->elems[2] = pvVar1;
              pnVar11->kids[2] = pnVar10;
              pnVar11->counts[2] = iVar13;
              *ppvVar8 = local_58;
              pnVar11->kids[1] = pnVar12;
              pnVar11->counts[1] = iVar7;
            }
            else {
              pnVar11->kids[3] = pnVar10;
              pnVar11->counts[3] = iVar13;
              pnVar11->elems[2] = local_58;
              pnVar11->kids[2] = pnVar12;
              pnVar11->counts[2] = iVar7;
            }
            pnVar12 = pnVar11->kids[0];
          }
          if (pnVar12 != (node234 *)0x0) {
            pnVar12->parent = pnVar11;
          }
          if (pnVar11->kids[1] != (node234 *)0x0) {
            pnVar11->kids[1]->parent = pnVar11;
          }
          if (pnVar11->kids[2] != (node234 *)0x0) {
            pnVar11->kids[2]->parent = pnVar11;
          }
          if (pnVar11->kids[3] != (node234 *)0x0) {
            pnVar11->kids[3]->parent = pnVar11;
          }
          goto LAB_0016d4b5;
        }
        pnVar2 = (node234 *)safemalloc(1,0x50,0);
        pnVar2->parent = pnVar11->parent;
        if (ppnVar9 == pnVar11->kids) {
          pnVar2->kids[0] = pnVar12;
          pnVar2->counts[0] = iVar7;
          pnVar2->elems[0] = local_58;
          pnVar2->kids[1] = pnVar10;
          pnVar2->counts[1] = iVar13;
          pnVar2->elems[1] = *ppvVar6;
          pnVar2->kids[2] = pnVar11->kids[1];
          pnVar2->counts[2] = pnVar11->counts[1];
LAB_0016d0d3:
          local_58 = *ppvVar8;
          pvVar1 = pnVar11->elems[2];
          pnVar11->kids[0] = pnVar11->kids[2];
          *ppvVar6 = pvVar1;
          pnVar11->kids[1] = pnVar11->kids[3];
          *(undefined8 *)pnVar11->counts = *(undefined8 *)(pnVar11->counts + 2);
        }
        else {
          if (ppnVar9 == pnVar11->kids + 1) {
            pnVar2->kids[0] = pnVar11->kids[0];
            pnVar2->counts[0] = pnVar11->counts[0];
            pnVar2->elems[0] = *ppvVar6;
            pnVar2->kids[1] = pnVar12;
            pnVar2->counts[1] = iVar7;
            pnVar2->elems[1] = local_58;
            pnVar2->kids[2] = pnVar10;
            pnVar2->counts[2] = iVar13;
            goto LAB_0016d0d3;
          }
          pnVar2->kids[0] = pnVar11->kids[0];
          pnVar2->counts[0] = pnVar11->counts[0];
          pnVar2->elems[0] = *ppvVar6;
          pnVar2->kids[1] = pnVar11->kids[1];
          pnVar2->counts[1] = pnVar11->counts[1];
          pnVar2->elems[1] = *ppvVar8;
          if (ppnVar9 == pnVar11->kids + 2) {
            pnVar2->kids[2] = pnVar12;
            pnVar2->counts[2] = iVar7;
            pnVar11->kids[0] = pnVar10;
            pnVar11->counts[0] = iVar13;
            *ppvVar6 = pnVar11->elems[2];
            pnVar11->kids[1] = pnVar11->kids[3];
            pnVar11->counts[1] = pnVar11->counts[3];
          }
          else {
            pnVar2->kids[2] = pnVar11->kids[2];
            pnVar2->counts[2] = pnVar11->counts[2];
            pnVar11->kids[0] = pnVar12;
            pnVar11->counts[0] = iVar7;
            *ppvVar6 = local_58;
            pnVar11->kids[1] = pnVar10;
            pnVar11->counts[1] = iVar13;
            local_58 = pnVar11->elems[2];
          }
        }
        pnVar11->kids[2] = (node234 *)0x0;
        pnVar11->kids[3] = (node234 *)0x0;
        pnVar2->kids[3] = (node234 *)0x0;
        pnVar11->counts[2] = 0;
        pnVar11->counts[3] = 0;
        pnVar2->counts[3] = 0;
        *ppvVar8 = (void *)0x0;
        ppvVar8[1] = (void *)0x0;
        pnVar2->elems[2] = (void *)0x0;
        if (pnVar2->kids[0] != (node234 *)0x0) {
          pnVar2->kids[0]->parent = pnVar2;
        }
        if (pnVar2->kids[1] != (node234 *)0x0) {
          pnVar2->kids[1]->parent = pnVar2;
        }
        if (pnVar2->kids[2] != (node234 *)0x0) {
          pnVar2->kids[2]->parent = pnVar2;
        }
        pnVar12 = pnVar11->kids[0];
        if (pnVar12 != (node234 *)0x0) {
          pnVar12->parent = pnVar11;
        }
        if (pnVar11->kids[1] != (node234 *)0x0) {
          pnVar11->kids[1]->parent = pnVar11;
        }
        iVar7 = pnVar2->counts[3] + pnVar2->counts[1] + pnVar2->counts[2] + pnVar2->counts[0];
        lVar3 = 7;
        do {
          iVar7 = (iVar7 + 1) - (uint)(pnVar2->kids[lVar3 + -1] == (node234 *)0x0);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 10);
        iVar13 = pnVar11->counts[3] + pnVar11->counts[1] + pnVar11->counts[2] + pnVar11->counts[0];
        lVar3 = 0;
        do {
          iVar13 = (iVar13 + 1) - (uint)(ppvVar6[lVar3] == (void *)0x0);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        pnVar4 = pnVar11->parent;
        if (pnVar4 == (node234_conflict *)0x0) {
          pnVar4 = (node234_conflict *)safemalloc(1,0x50,0);
          t->root = pnVar4;
          pnVar4->kids[0] = pnVar2;
          pnVar4 = t->root;
          pnVar4->counts[0] = iVar7;
          pnVar4->elems[0] = local_58;
          t->root->kids[1] = pnVar11;
          pnVar4 = t->root;
          pnVar4->counts[1] = iVar13;
          pnVar4->elems[1] = (void *)0x0;
          t->root->kids[2] = (node234 *)0x0;
          pnVar4 = t->root;
          pnVar4->counts[2] = 0;
          pnVar4->elems[2] = (void *)0x0;
          t->root->kids[3] = (node234 *)0x0;
          pnVar4 = t->root;
          pnVar4->counts[3] = 0;
          pnVar4->parent = (node234_conflict *)0x0;
          if (pnVar4->kids[0] != (node234 *)0x0) {
            pnVar4->kids[0]->parent = pnVar4;
          }
          if (pnVar4->kids[1] == (node234 *)0x0) {
            return e;
          }
          pnVar4->kids[1]->parent = pnVar4;
          return e;
        }
        if (pnVar4->kids[0] == pnVar11) {
          ppnVar9 = pnVar4->kids;
        }
        else if (pnVar4->kids[1] == pnVar11) {
          ppnVar9 = pnVar4->kids + 1;
        }
        else {
          ppnVar9 = pnVar4->kids + 3;
          if (pnVar4->kids[2] == pnVar11) {
            ppnVar9 = pnVar4->kids + 2;
          }
        }
        ppvVar6 = pnVar4->elems;
        ppvVar8 = pnVar4->elems + 1;
        pvVar1 = pnVar4->elems[1];
        pnVar10 = pnVar11;
        pnVar12 = pnVar2;
      } while (pvVar1 != (void *)0x0);
    }
    if (ppnVar9 == pnVar4->kids) {
      pnVar4->kids[2] = pnVar4->kids[1];
      pnVar4->counts[2] = pnVar4->counts[1];
      *ppvVar8 = *ppvVar6;
      pnVar4->kids[1] = pnVar11;
      pnVar4->counts[1] = iVar13;
      *ppvVar6 = local_58;
      pnVar4->kids[0] = pnVar2;
      pnVar4->counts[0] = iVar7;
    }
    else {
      pnVar4->kids[2] = pnVar11;
      pnVar4->counts[2] = iVar13;
      *ppvVar8 = local_58;
      pnVar4->kids[1] = pnVar2;
      pnVar4->counts[1] = iVar7;
      pnVar11 = pnVar2;
      pnVar2 = pnVar4->kids[0];
    }
    if (pnVar2 != (node234 *)0x0) {
      pnVar2->parent = pnVar4;
      pnVar11 = pnVar4->kids[1];
    }
    if (pnVar11 != (node234_conflict *)0x0) {
      pnVar11->parent = pnVar4;
    }
    pnVar11 = pnVar4;
    if (pnVar4->kids[2] != (node234 *)0x0) {
      pnVar4->kids[2]->parent = pnVar4;
    }
LAB_0016d4b5:
    while (pnVar4 = pnVar11->parent, pnVar4 != (node234_conflict *)0x0) {
      iVar7 = pnVar11->counts[3] + pnVar11->counts[1] + pnVar11->counts[2] + pnVar11->counts[0];
      lVar3 = 7;
      do {
        iVar7 = (iVar7 + 1) - (uint)(pnVar11->kids[lVar3 + -1] == (node234 *)0x0);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 10);
      if (pnVar4->kids[0] == pnVar11) {
        uVar5 = 0;
      }
      else if (pnVar4->kids[1] == pnVar11) {
        uVar5 = 1;
      }
      else {
        uVar5 = (ulong)(pnVar4->kids[2] == pnVar11) ^ 3;
      }
      pnVar4->counts[uVar5] = iVar7;
      pnVar11 = pnVar4;
    }
  }
  return e;
}

Assistant:

static void *add234_internal(tree234 * t, void *e, int index)
{
    node234 *n, **np, *left, *right;
    void *orig_e = e;
    int c, lcount, rcount;

    LOG(("adding node %p to tree %p\n", e, t));
    if (t->root == NULL) {
        t->root = snew(node234);
        t->root->elems[1] = t->root->elems[2] = NULL;
        t->root->kids[0] = t->root->kids[1] = NULL;
        t->root->kids[2] = t->root->kids[3] = NULL;
        t->root->counts[0] = t->root->counts[1] = 0;
        t->root->counts[2] = t->root->counts[3] = 0;
        t->root->parent = NULL;
        t->root->elems[0] = e;
        LOG(("  created root %p\n", t->root));
        return orig_e;
    }

    n = NULL; /* placate gcc; will always be set below since t->root != NULL */
    np = &t->root;
    while (*np) {
        int childnum;
        n = *np;
        LOG(("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        if (index >= 0) {
            if (!n->kids[0]) {
                /*
                 * Leaf node. We want to insert at kid position
                 * equal to the index:
                 *
                 *   0 A 1 B 2 C 3
                 */
                childnum = index;
            } else {
                /*
                 * Internal node. We always descend through it (add
                 * always starts at the bottom, never in the
                 * middle).
                 */
                do {                   /* this is a do ... while (0) to allow `break' */
                    if (index <= n->counts[0]) {
                        childnum = 0;
                        break;
                    }
                    index -= n->counts[0] + 1;
                    if (index <= n->counts[1]) {
                        childnum = 1;
                        break;
                    }
                    index -= n->counts[1] + 1;
                    if (index <= n->counts[2]) {
                        childnum = 2;
                        break;
                    }
                    index -= n->counts[2] + 1;
                    if (index <= n->counts[3]) {
                        childnum = 3;
                        break;
                    }
                    return NULL;       /* error: index out of range */
                } while (0);
            }
        } else {
            if ((c = t->cmp(e, n->elems[0])) < 0)
                childnum = 0;
            else if (c == 0)
                return n->elems[0];    /* already exists */
            else if (n->elems[1] == NULL
                     || (c = t->cmp(e, n->elems[1])) < 0) childnum = 1;
            else if (c == 0)
                return n->elems[1];    /* already exists */
            else if (n->elems[2] == NULL
                     || (c = t->cmp(e, n->elems[2])) < 0) childnum = 2;
            else if (c == 0)
                return n->elems[2];    /* already exists */
            else
                childnum = 3;
        }
        np = &n->kids[childnum];
        LOG(("  moving to child %d (%p)\n", childnum, *np));
    }

    /*
     * We need to insert the new element in n at position np.
     */
    left = NULL;
    lcount = 0;
    right = NULL;
    rcount = 0;
    while (n) {
        LOG(("  at %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        LOG(("  need to insert %p/%d [%p] %p/%d at position %d\n",
             left, lcount, e, right, rcount, (int)(np - n->kids)));
        if (n->elems[1] == NULL) {
            /*
             * Insert in a 2-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 2-node\n"));
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else {                   /* np == &n->kids[1] */
                LOG(("  inserting on right of 2-node\n"));
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            LOG(("  done\n"));
            break;
        } else if (n->elems[2] == NULL) {
            /*
             * Insert in a 3-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else if (np == &n->kids[1]) {
                LOG(("  inserting in middle of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            } else {                   /* np == &n->kids[2] */
                LOG(("  inserting on right of 3-node\n"));
                n->kids[3] = right;
                n->counts[3] = rcount;
                n->elems[2] = e;
                n->kids[2] = left;
                n->counts[2] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            if (n->kids[3])
                n->kids[3]->parent = n;
            LOG(("  done\n"));
            break;
        } else {
            node234 *m = snew(node234);
            m->parent = n->parent;
            LOG(("  splitting a 4-node; created new node %p\n", m));
            /*
             * Insert in a 4-node; split into a 2-node and a
             * 3-node, and move focus up a level.
             *
             * I don't think it matters which way round we put the
             * 2 and the 3. For simplicity, we'll put the 3 first
             * always.
             */
            if (np == &n->kids[0]) {
                m->kids[0] = left;
                m->counts[0] = lcount;
                m->elems[0] = e;
                m->kids[1] = right;
                m->counts[1] = rcount;
                m->elems[1] = n->elems[0];
                m->kids[2] = n->kids[1];
                m->counts[2] = n->counts[1];
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[1]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = left;
                m->counts[1] = lcount;
                m->elems[1] = e;
                m->kids[2] = right;
                m->counts[2] = rcount;
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[2]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = left;
                m->counts[2] = lcount;
                /* e = e; */
                n->kids[0] = right;
                n->counts[0] = rcount;
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else {                   /* np == &n->kids[3] */
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = n->kids[2];
                m->counts[2] = n->counts[2];
                n->kids[0] = left;
                n->counts[0] = lcount;
                n->elems[0] = e;
                n->kids[1] = right;
                n->counts[1] = rcount;
                e = n->elems[2];
            }
            m->kids[3] = n->kids[3] = n->kids[2] = NULL;
            m->counts[3] = n->counts[3] = n->counts[2] = 0;
            m->elems[2] = n->elems[2] = n->elems[1] = NULL;
            if (m->kids[0])
                m->kids[0]->parent = m;
            if (m->kids[1])
                m->kids[1]->parent = m;
            if (m->kids[2])
                m->kids[2]->parent = m;
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            LOG(("  left (%p): %p/%d [%p] %p/%d [%p] %p/%d\n", m,
                 m->kids[0], m->counts[0], m->elems[0],
                 m->kids[1], m->counts[1], m->elems[1],
                 m->kids[2], m->counts[2]));
            LOG(("  right (%p): %p/%d [%p] %p/%d\n", n,
                 n->kids[0], n->counts[0], n->elems[0],
                 n->kids[1], n->counts[1]));
            left = m;
            lcount = countnode234(left);
            right = n;
            rcount = countnode234(right);
        }
        if (n->parent)
            np = (n->parent->kids[0] == n ? &n->parent->kids[0] :
                  n->parent->kids[1] == n ? &n->parent->kids[1] :
                  n->parent->kids[2] == n ? &n->parent->kids[2] :
                  &n->parent->kids[3]);
        n = n->parent;
    }

    /*
     * If we've come out of here by `break', n will still be
     * non-NULL and all we need to do is go back up the tree
     * updating counts. If we've come here because n is NULL, we
     * need to create a new root for the tree because the old one
     * has just split into two. */
    if (n) {
        while (n->parent) {
            int count = countnode234(n);
            int childnum;
            childnum = (n->parent->kids[0] == n ? 0 :
                        n->parent->kids[1] == n ? 1 :
                        n->parent->kids[2] == n ? 2 : 3);
            n->parent->counts[childnum] = count;
            n = n->parent;
        }
    } else {
        LOG(("  root is overloaded, split into two\n"));
        t->root = snew(node234);
        t->root->kids[0] = left;
        t->root->counts[0] = lcount;
        t->root->elems[0] = e;
        t->root->kids[1] = right;
        t->root->counts[1] = rcount;
        t->root->elems[1] = NULL;
        t->root->kids[2] = NULL;
        t->root->counts[2] = 0;
        t->root->elems[2] = NULL;
        t->root->kids[3] = NULL;
        t->root->counts[3] = 0;
        t->root->parent = NULL;
        if (t->root->kids[0])
            t->root->kids[0]->parent = t->root;
        if (t->root->kids[1])
            t->root->kids[1]->parent = t->root;
        LOG(("  new root is %p/%d [%p] %p/%d\n",
             t->root->kids[0], t->root->counts[0],
             t->root->elems[0], t->root->kids[1], t->root->counts[1]));
    }

    return orig_e;
}